

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O3

void MWT::save_load(mwt *c,io_buf *model_file,bool read,bool text)

{
  unsigned_long *puVar1;
  ostream *poVar2;
  feature_index *policy_1;
  unsigned_long uVar3;
  feature_index *policy;
  unsigned_long *puVar4;
  policy_data *ppVar5;
  size_t policies_size;
  stringstream msg;
  size_t local_1c8;
  uint local_1bc;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if ((model_file->files)._end != (model_file->files)._begin) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"total: ",7);
    std::ostream::_M_insert<double>(c->total);
    bin_text_read_write_fixed_validated
              (model_file,(char *)&c->total,8,"",read,(stringstream *)local_1b8,text);
    local_1c8 = (long)(c->policies)._end - (long)(c->policies)._begin >> 3;
    bin_text_read_write_fixed_validated
              (model_file,(char *)&local_1c8,8,"",read,(stringstream *)local_1b8,text);
    if (read) {
      v_array<unsigned_long>::resize(&c->policies,local_1c8);
      puVar4 = (c->policies)._begin;
      (c->policies)._end = puVar4 + local_1c8;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"policies: ",10);
      puVar4 = (c->policies)._begin;
      puVar1 = (c->policies)._end;
      if (puVar4 != puVar1) {
        do {
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          puVar4 = puVar4 + 1;
        } while (puVar4 != puVar1);
        puVar4 = (c->policies)._begin;
      }
    }
    bin_text_read_write_fixed_validated
              (model_file,(char *)puVar4,local_1c8 << 3,"",read,(stringstream *)local_1b8,text);
    puVar1 = (c->policies)._end;
    local_1bc = (uint)read;
    for (puVar4 = (c->policies)._begin; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      uVar3 = *puVar4;
      ppVar5 = (c->evals)._begin;
      if (read) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"evals: ",7);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
        poVar2 = std::ostream::_M_insert<double>(ppVar5[uVar3].cost);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        uVar3 = *puVar4;
        ppVar5 = (c->evals)._begin;
      }
      bin_text_read_write_fixed_validated
                (model_file,(char *)(ppVar5 + uVar3),0x10,"",SUB41(local_1bc,0),
                 (stringstream *)local_1b8,text);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void save_load(mwt& c, io_buf& model_file, bool read, bool text)
{
  if (model_file.files.size() == 0)
    return;

  stringstream msg;

  // total
  msg << "total: " << c.total;
  bin_text_read_write_fixed_validated(model_file, (char*)&c.total, sizeof(c.total), "", read, msg, text);

  // policies
  size_t policies_size = c.policies.size();
  bin_text_read_write_fixed_validated(model_file, (char*)&policies_size, sizeof(policies_size), "", read, msg, text);

  if (read)
  {
    c.policies.resize(policies_size);
    c.policies.end() = c.policies.begin() + policies_size;
  }
  else
  {
    msg << "policies: ";
    for (feature_index& policy : c.policies) msg << policy << " ";
  }

  bin_text_read_write_fixed_validated(
      model_file, (char*)c.policies.begin(), policies_size * sizeof(feature_index), "", read, msg, text);

  // c.evals is already initialized nicely to the same size as the regressor.
  for (feature_index& policy : c.policies)
  {
    policy_data& pd = c.evals[policy];
    if (read)
      msg << "evals: " << policy << ":" << pd.action << ":" << pd.cost << " ";
    bin_text_read_write_fixed_validated(model_file, (char*)&c.evals[policy], sizeof(policy_data), "", read, msg, text);
  }
}